

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O0

REF_STATUS
ref_metric_eig_bal(REF_DBL *metric,REF_GRID ref_grid,REF_DBL *scalar,
                  REF_RECON_RECONSTRUCTION reconstruction,REF_INT p_norm,REF_DBL gradation,
                  REF_DBL target_complexity)

{
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL target_complexity_local;
  REF_DBL gradation_local;
  REF_INT p_norm_local;
  REF_RECON_RECONSTRUCTION reconstruction_local;
  REF_DBL *scalar_local;
  REF_GRID ref_grid_local;
  REF_DBL *metric_local;
  
  metric_local._4_4_ = ref_recon_hessian(ref_grid,scalar,metric,reconstruction);
  if (metric_local._4_4_ == 0) {
    metric_local._4_4_ = ref_recon_roundoff_limit(metric,ref_grid);
    if (metric_local._4_4_ == 0) {
      metric_local._4_4_ = ref_metric_histogram(metric,ref_grid,"hess.tec");
      if (metric_local._4_4_ == 0) {
        metric_local._4_4_ = ref_metric_local_scale(metric,ref_grid,p_norm);
        if (metric_local._4_4_ == 0) {
          metric_local._4_4_ =
               ref_metric_gradation_at_complexity(metric,ref_grid,gradation,target_complexity);
          if (metric_local._4_4_ == 0) {
            metric_local._4_4_ = 0;
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xa12,"ref_metric_eig_bal",(ulong)metric_local._4_4_,"gradation at complexity");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xa0f,"ref_metric_eig_bal",(ulong)metric_local._4_4_,"local scale lp norm");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xa0e,"ref_metric_eig_bal",(ulong)metric_local._4_4_,"histogram");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xa0d,"ref_metric_eig_bal",(ulong)metric_local._4_4_,
             "floor metric eigenvalues based on grid size and solution jitter");
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xa0b,
           "ref_metric_eig_bal",(ulong)metric_local._4_4_,"recon");
  }
  return metric_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_metric_eig_bal(REF_DBL *metric, REF_GRID ref_grid,
                                      REF_DBL *scalar,
                                      REF_RECON_RECONSTRUCTION reconstruction,
                                      REF_INT p_norm, REF_DBL gradation,
                                      REF_DBL target_complexity) {
  RSS(ref_recon_hessian(ref_grid, scalar, metric, reconstruction), "recon");
  RSS(ref_recon_roundoff_limit(metric, ref_grid),
      "floor metric eigenvalues based on grid size and solution jitter");
  RSS(ref_metric_histogram(metric, ref_grid, "hess.tec"), "histogram");
  RSS(ref_metric_local_scale(metric, ref_grid, p_norm), "local scale lp norm");
  RSS(ref_metric_gradation_at_complexity(metric, ref_grid, gradation,
                                         target_complexity),
      "gradation at complexity");

  return REF_SUCCESS;
}